

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t dim)

{
  complex<long_double> *local_20;
  
  TPZMatrix<std::complex<long_double>_>::TPZMatrix
            (&this->super_TPZMatrix<std::complex<long_double>_>,&PTR_PTR_016890e8,dim,dim);
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_01688e60;
  TPZVec<std::complex<long_double>_*>::TPZVec(&this->fElem,dim + 1);
  TPZVec<std::complex<long_double>_>::TPZVec(&this->fStorage,0);
  local_20 = (complex<long_double> *)0x0;
  TPZVec<std::complex<long_double>_*>::Fill(&this->fElem,&local_20,0,-1);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
}